

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

void __thiscall r_exec::HLPBindingMap::init_from_hlp(HLPBindingMap *this,Code *hlp)

{
  byte bVar1;
  char cVar2;
  uint8_t id;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  size_type sVar6;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  _Fact *pattern;
  uint16_t i_1;
  uint16_t obj_count;
  uint16_t obj_set_index;
  undefined4 local_24;
  ushort local_1e;
  Atom a;
  uint16_t i;
  uint16_t tpl_arg_count;
  uint16_t tpl_arg_set_index;
  Code *hlp_local;
  HLPBindingMap *this_local;
  
  (*(hlp->super__Object)._vptr__Object[5])(hlp,1);
  uVar3 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[5])
            (hlp,(ulong)uVar3,extraout_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar3));
  bVar1 = r_code::Atom::getAtomCount();
  _a = (ushort)bVar1;
  uVar7 = extraout_RDX_00;
  for (local_1e = 1; local_1e <= _a; local_1e = local_1e + 1) {
    iVar5 = (*(hlp->super__Object)._vptr__Object[5])
                      (hlp,(ulong)(ushort)((uint)uVar3 + (uint)local_1e),uVar7,
                       (ulong)((uint)uVar3 + (uint)local_1e));
    local_24 = *(undefined4 *)CONCAT44(extraout_var,iVar5);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7a) {
      id = r_code::Atom::asIndex();
      BindingMap::add_unbound_value(&this->super_BindingMap,id);
    }
    r_code::Atom::~Atom((Atom *)&local_24);
    uVar7 = extraout_RDX_01;
  }
  sVar6 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                    (&(this->super_BindingMap).map);
  (this->super_BindingMap).first_index = (uint16_t)sVar6;
  (*(hlp->super__Object)._vptr__Object[5])(hlp,2);
  uVar3 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[5])
            (hlp,(ulong)uVar3,extraout_RDX_02,CONCAT62((int6)(sVar6 >> 0x10),uVar3));
  bVar1 = r_code::Atom::getAtomCount();
  for (pattern._6_2_ = 1; pattern._6_2_ <= bVar1; pattern._6_2_ = pattern._6_2_ + 1) {
    uVar7 = 0;
    (*(hlp->super__Object)._vptr__Object[5])(hlp,(ulong)(ushort)(uVar3 + pattern._6_2_));
    uVar4 = r_code::Atom::asIndex();
    iVar5 = (*(hlp->super__Object)._vptr__Object[9])
                      (hlp,(ulong)uVar4,extraout_RDX_03,CONCAT62((int6)((ulong)uVar7 >> 0x10),uVar4)
                      );
    init_from_pattern(this,(Code *)CONCAT44(extraout_var_00,iVar5),pattern._6_2_ - 1);
  }
  return;
}

Assistant:

void HLPBindingMap::init_from_hlp(const Code *hlp)   // hlp is cst or mdl.
{
    uint16_t tpl_arg_set_index = hlp->code(HLP_TPL_ARGS).asIndex();
    uint16_t tpl_arg_count = hlp->code(tpl_arg_set_index).getAtomCount();

    for (uint16_t i = 1; i <= tpl_arg_count; ++i) {
        Atom a = hlp->code(tpl_arg_set_index + i);

        if (a.getDescriptor() == Atom::VL_PTR) {
            add_unbound_value(a.asIndex());
        }
    }

    first_index = map.size();
    uint16_t obj_set_index = hlp->code(HLP_OBJS).asIndex();
    uint16_t obj_count = hlp->code(obj_set_index).getAtomCount();

    for (uint16_t i = 1; i <= obj_count; ++i) {
        _Fact *pattern = (_Fact *)hlp->get_reference(hlp->code(obj_set_index + i).asIndex());
        init_from_pattern(pattern, i - 1);
    }
}